

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O0

Pass * wasm::createRemoveUnusedNamesPass(void)

{
  RemoveUnusedNames *this;
  
  this = (RemoveUnusedNames *)operator_new(0x160);
  memset(this,0,0x160);
  RemoveUnusedNames::RemoveUnusedNames(this);
  return (Pass *)this;
}

Assistant:

Pass* createRemoveUnusedNamesPass() { return new RemoveUnusedNames(); }